

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::relocate
          (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *this,qsizetype offset,
          AnchorVertexPair ***data)

{
  AnchorVertexPair **d_first;
  AnchorVertexPair **ppAVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QtGraphicsAnchorLayout::AnchorVertexPair*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (AnchorVertexPair ***)0x0) {
    ppAVar1 = *data;
    if ((this->ptr <= ppAVar1) && (ppAVar1 < this->ptr + this->size)) {
      *data = ppAVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }